

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

QString * statusTipConfigKey(void)

{
  DataPointer *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *this;
  QArrayDataPointer<char16_t> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_20,(Data *)0x0,L"statustip",9);
  QString::QString((QString *)this,in_RDI);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static inline QString statusTipConfigKey()     { return QStringLiteral("statustip"); }